

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

int32_t ncat(char *buffer,uint32_t buflen,...)

{
  char cVar1;
  undefined8 *in_RAX;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar3;
  undefined8 *puVar4;
  undefined8 in_R8;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 in_R9;
  char *pcVar7;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  undefined8 local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list args;
  
  local_b8[2] = in_RDX;
  local_b8[3] = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if ((char)in_RAX != '\0') {
    uStack_88 = in_XMM0_Qa;
    args[0].overflow_arg_area = in_XMM1_Qa;
  }
  if (buffer != (char *)0x0) {
    in_RAX = local_b8;
    uVar2 = 0x10;
    lVar3 = 0;
    puVar5 = (undefined8 *)&stack0x00000008;
LAB_0029ca26:
    if (uVar2 < 0x29) {
      uVar6 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      puVar4 = puVar5;
      puVar5 = (undefined8 *)((long)in_RAX + uVar6);
    }
    else {
      puVar4 = puVar5 + 1;
    }
    pcVar7 = (char *)*puVar5;
    if (pcVar7 != (char *)0x0) {
      puVar5 = puVar4;
      if (lVar3 != 0x9c) {
        do {
          cVar1 = *pcVar7;
          if (cVar1 == '\0') goto LAB_0029ca26;
          pcVar7 = pcVar7 + 1;
          buffer[lVar3] = cVar1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x9c);
        lVar3 = 0x9c;
      }
      goto LAB_0029ca26;
    }
    buffer[lVar3] = '\0';
  }
  return (int32_t)in_RAX;
}

Assistant:

static int32_t ncat(char *buffer, uint32_t buflen, ...) {
  va_list args;
  char *str;
  char *p = buffer;
  const char* e = buffer + buflen - 1;

  if (buffer == NULL || buflen < 1) {
    return -1;
  }

  va_start(args, buflen);
  while ((str = va_arg(args, char *)) != 0) {
    char c;
    while (p != e && (c = *str++) != 0) {
      *p++ = c;
    }
  }
  *p = 0;
  va_end(args);

  return static_cast<int32_t>(p - buffer);
}